

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potion.c
# Opt level: O0

void make_confused(long xtime,boolean talk)

{
  uint uVar1;
  boolean bVar2;
  char *pcVar3;
  bool bVar4;
  long old;
  boolean talk_local;
  long xtime_local;
  
  uVar1 = u.uprops[0x1c].intrinsic;
  if (((xtime == 0) && (u.uprops[0x1c].intrinsic != 0)) && (talk != '\0')) {
    bVar4 = false;
    if (u.uprops[0x23].intrinsic != 0) {
      bVar4 = true;
      if ((u.uprops[0x24].extrinsic == 0) && (bVar4 = false, u.umonnum != u.umonster)) {
        bVar2 = dmgtype(youmonst.data,0x24);
        bVar4 = bVar2 != '\0';
      }
      bVar4 = (bool)(bVar4 ^ 1);
    }
    pcVar3 = "confused";
    if (bVar4) {
      pcVar3 = "trippy";
    }
    pline("You feel less %s now.",pcVar3);
  }
  if (((xtime != 0) && (uVar1 == 0)) || ((xtime == 0 && (uVar1 != 0)))) {
    iflags.botl = '\x01';
  }
  set_itimeout(&u.uprops[0x1c].intrinsic,xtime);
  return;
}

Assistant:

void make_confused(long xtime, boolean talk)
{
	long old = HConfusion;

	if (!xtime && old) {
		if (talk)
		    pline("You feel less %s now.",
			Hallucination ? "trippy" : "confused");
	}
	if ((xtime && !old) || (!xtime && old)) iflags.botl = TRUE;

	set_itimeout(&HConfusion, xtime);
}